

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O0

void ecs_dbg_entity(ecs_world_t *world,ecs_entity_t entity,ecs_dbg_entity_t *dbg_out)

{
  _Bool _Var1;
  ecs_table_t *local_70;
  undefined1 local_60 [8];
  ecs_entity_info_t info;
  ecs_table_t *local_38;
  ecs_type_t local_30;
  undefined8 local_28;
  ecs_dbg_entity_t *dbg_out_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  memset(&info.row,0,0x20);
  dbg_out->entity = entity;
  dbg_out->table = local_38;
  dbg_out->type = local_30;
  dbg_out->row = (undefined4)local_28;
  dbg_out->is_watched = (_Bool)local_28._4_1_;
  *(undefined3 *)&dbg_out->field_0x1d = local_28._5_3_;
  info._24_8_ = entity;
  memset(local_60,0,0x20);
  _Var1 = ecs_get_info(world,entity,(ecs_entity_info_t *)local_60);
  if (_Var1) {
    dbg_out->table = (ecs_table_t *)info.record;
    dbg_out->row = (int32_t)info.data;
    dbg_out->is_watched = (_Bool)(info.data._4_1_ & 1);
    if (info.record == (ecs_record_t *)0x0) {
      local_70 = (ecs_table_t *)0x0;
    }
    else {
      local_70 = (info.record)->table;
    }
    dbg_out->type = (ecs_type_t)local_70;
  }
  return;
}

Assistant:

void ecs_dbg_entity(
    ecs_world_t *world, 
    ecs_entity_t entity, 
    ecs_dbg_entity_t *dbg_out)
{
    *dbg_out = (ecs_dbg_entity_t){.entity = entity};
    
    ecs_entity_info_t info = { 0 };
    if (ecs_get_info(world, entity, &info)) {
        dbg_out->table = info.table;
        dbg_out->row = info.row;
        dbg_out->is_watched = info.is_watched;
        dbg_out->type = info.table ? info.table->type : NULL;
    }
}